

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::Read
          (PosixSequentialFile *this,size_t n,Slice *result,char *scratch)

{
  ssize_t sVar1;
  int *piVar2;
  void *in_R8;
  long in_FS_OFFSET;
  _Alloc_hider local_38;
  size_type local_30;
  
  local_30 = *(size_type *)(in_FS_OFFSET + 0x28);
  (this->super_SequentialFile)._vptr_SequentialFile = (_func_int **)0x0;
  do {
    sVar1 = read(*(int *)(n + 8),in_R8,(size_t)result);
    if (-1 < sVar1) {
      *(void **)scratch = in_R8;
      *(ssize_t *)(scratch + 8) = sVar1;
      goto LAB_00d2ccb8;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  PosixError((string *)&local_38,(int)*(undefined8 *)(n + 0x10));
  (this->super_SequentialFile)._vptr_SequentialFile = (_func_int **)local_38._M_p;
LAB_00d2ccb8:
  if (*(size_type *)(in_FS_OFFSET + 0x28) == local_30) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
    Status status;
    while (true) {
      ::ssize_t read_size = ::read(fd_, scratch, n);
      if (read_size < 0) {  // Read error.
        if (errno == EINTR) {
          continue;  // Retry
        }
        status = PosixError(filename_, errno);
        break;
      }
      *result = Slice(scratch, read_size);
      break;
    }
    return status;
  }